

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udataswp.cpp
# Opt level: O3

int32_t uprv_copyArray16(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                        UErrorCode *pErrorCode)

{
  if ((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((length < 0 || (inData == (void *)0x0 || ds == (UDataSwapper *)0x0)) ||
       ((length & 1U) != 0 || outData == (void *)0x0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      length = 0;
    }
    else if (inData != outData && length != 0) {
      memcpy(outData,inData,(ulong)(uint)length);
    }
    return length;
  }
  return 0;
}

Assistant:

static int32_t U_CALLCONV
uprv_copyArray16(const UDataSwapper *ds,
                 const void *inData, int32_t length, void *outData,
                 UErrorCode *pErrorCode) {
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<0 || (length&1)!=0 || outData==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    if(length>0 && inData!=outData) {
        uprv_memcpy(outData, inData, length);
    }
    return length;
}